

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O0

void CreateIntegerTable(Connection *con,int64_t count)

{
  StringRef capturedExpression;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_ffffffffffffff08;
  Flags in_stack_ffffffffffffff0c;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  SourceLineInfo *this;
  AssertionHandler *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  allocator *paVar3;
  size_type in_stack_ffffffffffffff30;
  ExprLhs<bool> *in_stack_ffffffffffffff38;
  AssertionHandler *in_stack_ffffffffffffff40;
  long in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  Connection *in_stack_ffffffffffffff58;
  SourceLineInfo local_78;
  StringRef local_68;
  
  local_68 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_ffffffffffffff17,
                                         CONCAT16(in_stack_ffffffffffffff16,
                                                  in_stack_ffffffffffffff10)),
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this = &local_78;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
             ,0x14);
  Catch::StringRef::StringRef((StringRef *)in_stack_ffffffffffffff20,(char *)this);
  capturedExpression.m_size = in_stack_ffffffffffffff30;
  capturedExpression.m_start = in_stack_ffffffffffffff28;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_ffffffffffffff20,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
             capturedExpression,in_stack_ffffffffffffff0c);
  paVar3 = (allocator *)&stack0xffffffffffffff47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff48,
             "CREATE TABLE integers AS SELECT range AS i FROM range ($1)",paVar3);
  duckdb::Connection::Query<long>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  uVar1 = duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)0x77d1ad);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x77d1f3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_ffffffffffffff10)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_ffffffffffffff10)));
  return;
}

Assistant:

static void CreateIntegerTable(Connection *con, int64_t count) {
	REQUIRE_NO_FAIL(con->Query("CREATE TABLE integers AS SELECT range AS i FROM range ($1)", count));
}